

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O1

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenId(Lexer *this)

{
  size_t sVar1;
  size_t __n;
  int iVar2;
  Token *pTVar3;
  Token *this_00;
  TokenType type;
  undefined8 *puVar4;
  Lexer *in_RSI;
  bool bVar5;
  vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  keywords;
  string id;
  Position local_88;
  _Tuple_impl<0UL,_pfederc::Token_*,_std::default_delete<pfederc::Token>_> local_70;
  undefined1 *local_68;
  size_t local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  Position local_48;
  
  local_68 = &local_58;
  local_60 = 0;
  local_58 = 0;
  std::__cxx11::string::reserve((ulong)&local_68);
  iVar2 = in_RSI->currentChar;
  if (iVar2 == 0x5f) {
    do {
      std::__cxx11::string::push_back((char)&local_68);
      nextChar(in_RSI);
      iVar2 = in_RSI->currentChar;
    } while (iVar2 == 0x5f);
  }
  if (iVar2 - 0x30U < 10) {
    getCurrentCursor(&local_88,in_RSI);
    sVar1 = in_RSI->currentEndIndex;
    local_48.line = (size_t)operator_new(0x38);
    ((Error<pfederc::LexerErrorCode> *)local_48.line)->logLevel = LVL_ERROR;
    ((Error<pfederc::LexerErrorCode> *)local_48.line)->err = LEX_ERR_ID_NO_DIGIT_AFTER_ANYS;
    (((Error<pfederc::LexerErrorCode> *)local_48.line)->pos).line = local_88.line;
    (((Error<pfederc::LexerErrorCode> *)local_48.line)->pos).startIndex = sVar1;
    (((Error<pfederc::LexerErrorCode> *)local_48.line)->pos).endIndex = sVar1;
LAB_0010720d:
    (((Error<pfederc::LexerErrorCode> *)local_48.line)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((Error<pfederc::LexerErrorCode> *)local_48.line)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (((Error<pfederc::LexerErrorCode> *)local_48.line)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                        *)in_RSI);
    if ((Error<pfederc::LexerErrorCode> *)local_48.line != (Error<pfederc::LexerErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::LexerErrorCode>_> *)&local_48,
                 (Error<pfederc::LexerErrorCode> *)local_48.line);
    }
  }
  else {
    iVar2 = isalpha(iVar2);
    if (iVar2 == 0) {
      iVar2 = std::__cxx11::string::compare((char *)&local_68);
      if (iVar2 != 0) {
        getCurrentCursor(&local_88,in_RSI);
        local_48.line = (size_t)operator_new(0x38);
        ((Error<pfederc::LexerErrorCode> *)local_48.line)->logLevel = LVL_ERROR;
        ((Error<pfederc::LexerErrorCode> *)local_48.line)->err = LEX_ERR_ID_NOT_JUST_ANYS;
        (((Error<pfederc::LexerErrorCode> *)local_48.line)->pos).line = local_88.line;
        (((Error<pfederc::LexerErrorCode> *)local_48.line)->pos).startIndex = local_88.startIndex;
        (((Error<pfederc::LexerErrorCode> *)local_48.line)->pos).endIndex = local_88.endIndex;
        goto LAB_0010720d;
      }
      getCurrentCursor(&local_88,in_RSI);
      this_00 = (Token *)operator_new(0x30);
      pTVar3 = in_RSI->currentToken;
      type = TOK_ANY;
    }
    else {
      while ((in_RSI->currentChar == 0x5f || (iVar2 = isalnum(in_RSI->currentChar), iVar2 != 0))) {
        std::__cxx11::string::push_back((char)&local_68);
        nextChar(in_RSI);
      }
      if (local_60 - 2 < 7) {
        std::
        vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_88,
                 (vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(&DW_ref___gxx_personality_v0 + local_60 * 3));
        pTVar3 = (Token *)this->_vptr_Lexer;
        local_70.super__Head_base<0UL,_pfederc::Token_*,_false>._M_head_impl =
             (_Head_base<0UL,_pfederc::Token_*,_false>)
             (_Head_base<0UL,_pfederc::Token_*,_false>)this;
        if (local_88.line != local_88.startIndex) {
          puVar4 = (undefined8 *)local_88.line;
          do {
            __n = puVar4[1];
            if (__n == local_60) {
              if (__n == 0) {
                bVar5 = true;
              }
              else {
                iVar2 = bcmp((void *)*puVar4,local_68,__n);
                bVar5 = iVar2 == 0;
              }
            }
            else {
              bVar5 = false;
            }
            if (bVar5) {
              getCurrentCursor(&local_48,in_RSI);
              pTVar3 = (Token *)operator_new(0x30);
              Token::Token(pTVar3,in_RSI->currentToken,*(TokenType *)(puVar4 + 4),&local_48);
              this = (Lexer *)local_70.super__Head_base<0UL,_pfederc::Token_*,_false>._M_head_impl;
              if (bVar5) {
                *(Token **)local_70.super__Head_base<0UL,_pfederc::Token_*,_false>._M_head_impl =
                     pTVar3;
                std::
                vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~vector((vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_88);
                goto LAB_00107459;
              }
            }
            puVar4 = puVar4 + 5;
          } while (puVar4 != (undefined8 *)local_88.startIndex);
        }
        this = (Lexer *)local_70.super__Head_base<0UL,_pfederc::Token_*,_false>._M_head_impl;
        *(Token **)local_70.super__Head_base<0UL,_pfederc::Token_*,_false>._M_head_impl = pTVar3;
        std::
        vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_88);
      }
      iVar2 = std::__cxx11::string::compare((char *)&local_68);
      if (iVar2 == 0) {
        getCurrentCursor(&local_88,in_RSI);
        this_00 = (Token *)operator_new(0x30);
        pTVar3 = in_RSI->currentToken;
        type = TOK_OP_NULL;
      }
      else {
        getCurrentCursor(&local_88,in_RSI);
        this_00 = (Token *)operator_new(0x30);
        pTVar3 = in_RSI->currentToken;
        type = TOK_ID;
      }
    }
    Token::Token(this_00,pTVar3,type,&local_88);
    *(Token **)this = this_00;
  }
LAB_00107459:
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (tuple<pfederc::Token_*,_std::default_delete<pfederc::Token>_>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenId() noexcept {
  std::string id;
  id.reserve(16);
  // eat _ (important for checking if followed by alphabetic char)
  while (currentChar == '_') {
    id += currentChar;
    nextChar();
  }
  // must be followed by alpha character or just valid _ (TokenType::TOK_ANY)
  if (isdigit(currentChar)) {
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_ID_NO_DIGIT_AFTER_ANYS, Position{getCurrentCursor().line,
        currentEndIndex, currentEndIndex}));
  } else if (!isalpha(currentChar)) {
    // check for any
    if (id == "_")
      return std::make_unique<Token>(currentToken, TokenType::TOK_ANY, getCurrentCursor());
    // __+ is not allowed
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_ID_NOT_JUST_ANYS, getCurrentCursor()));
  }

  while (currentChar == '_' || isalnum(currentChar)) {
    id += currentChar;
    nextChar();
  }

  // check if keword
  if (id.size() >= KEYWORDS_MIN_STRING_LENGTH
    && id.size() < KEYWORDS_MIN_STRING_LENGTH + KEYWORDS_LENGTH) {
    auto keywords = KEYWORDS[id.size() - KEYWORDS_MIN_STRING_LENGTH];
    for (const auto &tpl : keywords) {
      if (std::get<1>(tpl) == id)
        return std::make_unique<Token>(currentToken, std::get<0>(tpl), getCurrentCursor());
    }
  }
  // check if operator
  if (id == "null")
    return std::make_unique<Token>(currentToken, TokenType::TOK_OP_NULL, getCurrentCursor());

  return std::make_unique<Token>(currentToken, TokenType::TOK_ID, getCurrentCursor());
}